

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_udp.c
# Opt level: O3

void * csp_if_udp_rx_loop(void *param)

{
  long lVar1;
  int iVar2;
  csp_iface_t *iface;
  sockaddr *in_RSI;
  sockaddr local_30;
  
  lVar1 = *(long *)((long)param + 0x18);
  iVar2 = *(int *)(lVar1 + 0x28);
  if (iVar2 == 0) {
    do {
      iVar2 = socket(2,2,0x11);
      *(int *)(lVar1 + 0x28) = iVar2;
      local_30.sa_data[6] = '\0';
      local_30.sa_data[7] = '\0';
      local_30.sa_data[8] = '\0';
      local_30.sa_data[9] = '\0';
      local_30.sa_data[10] = '\0';
      local_30.sa_data[0xb] = '\0';
      local_30.sa_data[0xc] = '\0';
      local_30.sa_data[0xd] = '\0';
      local_30.sa_family = 2;
      local_30.sa_data[2] = '\0';
      local_30.sa_data[3] = '\0';
      local_30.sa_data[4] = '\0';
      local_30.sa_data[5] = '\0';
      local_30.sa_data._0_2_ = *(ushort *)(lVar1 + 8) << 8 | *(ushort *)(lVar1 + 8) >> 8;
      in_RSI = &local_30;
      bind(iVar2,&local_30,0x10);
      iVar2 = *(int *)(lVar1 + 0x28);
      if (-1 < iVar2) break;
      in_RSI = (sockaddr *)(ulong)*(uint *)(lVar1 + 8);
      csp_print_func("  UDP server waiting for port %d\n");
      sleep(1);
      iVar2 = *(int *)(lVar1 + 0x28);
    } while (iVar2 == 0);
  }
  do {
    iVar2 = csp_if_udp_rx_work(iVar2,(size_t)in_RSI,(csp_iface_t *)param);
    if (iVar2 == -1) {
      usleep(10000);
    }
    else if (iVar2 == -2) {
      *(int *)((long)param + 0x38) = *(int *)((long)param + 0x38) + 1;
    }
    iVar2 = *(int *)(lVar1 + 0x28);
  } while( true );
}

Assistant:

void * csp_if_udp_rx_loop(void * param) {

	csp_iface_t * iface = param;
	csp_if_udp_conf_t * ifconf = iface->driver_data;

	while (ifconf->sockfd == 0) {

		ifconf->sockfd = socket(AF_INET, SOCK_DGRAM, PF_PACKET);

		struct sockaddr_in server_addr = {0};
		server_addr.sin_family = AF_INET;
		server_addr.sin_addr.s_addr = htonl(INADDR_ANY);
		server_addr.sin_port = htons(ifconf->lport);

		bind(ifconf->sockfd, (struct sockaddr *)&server_addr, sizeof(server_addr));

		if (ifconf->sockfd < 0) {
			csp_print("  UDP server waiting for port %d\n", ifconf->lport);
			sleep(1);
			continue;
		}
		break;
	}

	while (1) {
		int ret;
		ret = csp_if_udp_rx_work(ifconf->sockfd, 0, iface);
		if (ret == CSP_ERR_INVAL) {
			iface->rx_error++;
		} else if (ret == CSP_ERR_NOMEM) {
			usleep(10000);
		}
	}

	return NULL;
}